

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_addi_i64_mipsel(TCGContext_conflict4 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,int64_t arg2)

{
  TCGv_i64 arg2_00;
  TCGv_i64 t0;
  int64_t arg2_local;
  TCGv_i64 arg1_local;
  TCGv_i64 ret_local;
  TCGContext_conflict4 *tcg_ctx_local;
  
  if (arg2 == 0) {
    tcg_gen_mov_i64_mipsel(tcg_ctx,ret,arg1);
  }
  else {
    arg2_00 = tcg_const_i64_mipsel(tcg_ctx,arg2);
    tcg_gen_add_i64(tcg_ctx,ret,arg1,arg2_00);
    tcg_temp_free_i64(tcg_ctx,arg2_00);
  }
  return;
}

Assistant:

void tcg_gen_addi_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, int64_t arg2)
{
    /* some cases can be optimized here */
    if (arg2 == 0) {
        tcg_gen_mov_i64(tcg_ctx, ret, arg1);
    } else {
        TCGv_i64 t0 = tcg_const_i64(tcg_ctx, arg2);
        tcg_gen_add_i64(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
    }
}